

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
poplar::
map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
::map(map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  int iVar1;
  bool bVar2;
  value_type_conflict3 vVar3;
  uint32_t uVar4;
  uint32_t capa_bits_00;
  undefined8 uVar5;
  reference pvVar6;
  uint64_t in_RDX;
  undefined4 in_ESI;
  undefined1 *in_RDI;
  array<unsigned_char,_256UL> *this_00;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffdc0;
  compact_fkhash_nlm<int,_16UL> *this_01;
  value_type_conflict3 *__u;
  compact_fkhash_nlm<int,_16UL> local_1f0;
  value_type_conflict3 local_1b0 [276];
  uint32_t in_stack_ffffffffffffff64;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffff70;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0x20;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::compact_fkhash_trie(in_stack_fffffffffffffdc0);
  compact_fkhash_nlm<int,_16UL>::compact_fkhash_nlm
            ((compact_fkhash_nlm<int,_16UL> *)in_stack_fffffffffffffdc0);
  memset(in_RDI + 0x1c8,0,0x100);
  *(undefined4 *)(in_RDI + 0x2c8) = 0;
  *(undefined8 *)(in_RDI + 0x2d0) = 0;
  bVar2 = is_power2(in_RDX);
  if (!bVar2) {
    uVar5 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    __cxa_throw(uVar5,&exception::typeinfo,exception::~exception);
  }
  *in_RDI = 1;
  *(uint64_t *)(in_RDI + 8) = in_RDX;
  uVar4 = bit_tools::ceil_log2((uint64_t)in_stack_fffffffffffffdc0);
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::compact_fkhash_trie
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff64);
  this_00 = (array<unsigned_char,_256UL> *)(in_RDI + 0x10);
  __u = local_1b0;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::operator=(in_stack_fffffffffffffdc0,
              (compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::~compact_fkhash_trie(in_stack_fffffffffffffdc0);
  capa_bits_00 = compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                 ::capa_bits((compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                              *)0x142983);
  compact_fkhash_nlm<int,_16UL>::compact_fkhash_nlm
            ((compact_fkhash_nlm<int,_16UL> *)CONCAT44(uVar4,in_ESI),capa_bits_00);
  this_01 = &local_1f0;
  compact_fkhash_nlm<int,_16UL>::operator=
            (this_01,(compact_fkhash_nlm<int,_16UL> *)
                     CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  compact_fkhash_nlm<int,_16UL>::~compact_fkhash_nlm(this_01);
  std::array<unsigned_char,_256UL>::fill(this_00,__u);
  iVar1 = *(int *)(in_RDI + 0x2c8);
  *(int *)(in_RDI + 0x2c8) = iVar1 + 1;
  vVar3 = (value_type_conflict3)iVar1;
  pvVar6 = std::array<unsigned_char,_256UL>::operator[]
                     ((array<unsigned_char,_256UL> *)this_01,
                      CONCAT17(vVar3,in_stack_fffffffffffffdb8));
  *pvVar6 = vVar3;
  return;
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }